

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

void ZSTD_ldm_makeEntryAndInsertByTag
               (ldmState_t *ldmState,U64 rollingHash,U32 hBits,U32 offset,ldmParams_t ldmParams)

{
  BYTE *pBVar1;
  U32 UVar2;
  U32 UVar3;
  ulong uVar4;
  ldmEntry_t lVar5;
  
  UVar2 = ZSTD_ldm_getTag(rollingHash,hBits,ldmParams.hashRateLog);
  if ((-1 << ((byte)ldmParams.hashRateLog & 0x1f) ^ UVar2) == 0xffffffff) {
    UVar2 = ZSTD_ldm_getSmallHash(rollingHash,hBits);
    UVar3 = ZSTD_ldm_getChecksum(rollingHash,hBits);
    uVar4 = (ulong)UVar2;
    lVar5.checksum = UVar3;
    lVar5.offset = offset;
    pBVar1 = ldmState->bucketOffsets;
    ldmState->hashTable[(uVar4 << ((byte)ldmParams.bucketSizeLog & 0x3f)) + (ulong)pBVar1[uVar4]] =
         lVar5;
    pBVar1[uVar4] = ~(byte)(-1 << ((byte)ldmParams.bucketSizeLog & 0x1f)) & pBVar1[uVar4] + 1;
  }
  return;
}

Assistant:

static void ZSTD_ldm_makeEntryAndInsertByTag(ldmState_t* ldmState,
                                             U64 const rollingHash,
                                             U32 const hBits,
                                             U32 const offset,
                                             ldmParams_t const ldmParams)
{
    U32 const tag = ZSTD_ldm_getTag(rollingHash, hBits, ldmParams.hashRateLog);
    U32 const tagMask = ((U32)1 << ldmParams.hashRateLog) - 1;
    if (tag == tagMask) {
        U32 const hash = ZSTD_ldm_getSmallHash(rollingHash, hBits);
        U32 const checksum = ZSTD_ldm_getChecksum(rollingHash, hBits);
        ldmEntry_t entry;
        entry.offset = offset;
        entry.checksum = checksum;
        ZSTD_ldm_insertEntry(ldmState, hash, entry, ldmParams);
    }
}